

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::verify
          (BufferCopyToImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  size_type *psVar1;
  byte bVar2;
  VkCommandBuffer_s VVar3;
  InstanceInterface *vki;
  DeviceInterface *vkd;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  VkCommandBuffer commandBuffer;
  undefined8 uVar4;
  VkResult VVar5;
  uint uVar6;
  int iVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  VkMemoryPropertyFlags in_stack_fffffffffffffbf8;
  string local_3f8;
  pointer local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  long *local_3c0;
  undefined8 local_3b8;
  long local_3b0;
  undefined8 uStack_3a8;
  long *local_3a0;
  undefined8 local_398;
  long local_390;
  undefined8 uStack_388;
  EVP_PKEY_CTX *local_380;
  ulong *local_378;
  long local_370;
  ulong local_368;
  long lStack_360;
  ulong *local_358;
  long local_350;
  ulong local_348;
  long lStack_340;
  Hex<8UL> local_338;
  long local_330;
  ulong local_328 [2];
  Hex<8UL> local_318;
  long local_310;
  ulong local_308 [2];
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  ulong *local_2d8;
  long lStack_2d0;
  ulong local_2c8;
  long lStack_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  undefined8 local_2ac;
  undefined4 local_2a4;
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_260;
  VkDeviceMemory local_248;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_240;
  VkBuffer local_228;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_220;
  ResultCollector *local_200;
  uchar *local_1f8;
  VkQueue local_1f0;
  VkCommandBuffer local_1e8;
  DeviceInterface *pDStack_1e0;
  VkDevice local_1d8;
  deUint64 dStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  VkDevice local_198;
  VkCommandPool VStack_190;
  undefined8 local_188;
  deUint64 local_180;
  pointer local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  ios_base local_138 [264];
  
  local_200 = *(ResultCollector **)(ctx + 8);
  puVar9 = *(undefined8 **)(ctx + 0x10);
  vki = (InstanceInterface *)*puVar9;
  vkd = (DeviceInterface *)puVar9[1];
  physicalDevice = (VkPhysicalDevice)puVar9[2];
  device = (VkDevice)puVar9[3];
  local_1f0 = (VkQueue)puVar9[4];
  local_1f8 = sig;
  createBeginCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_1a8,vkd,device,(VkCommandPool)puVar9[9],
             (VkCommandBufferLevel)tbs);
  local_1d8 = local_198;
  dStack_1d0 = VStack_190.m_internal;
  local_1e8 = (VkCommandBuffer)local_1a8._0_8_;
  pDStack_1e0 = (DeviceInterface *)local_1a8._8_8_;
  local_380 = ctx;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_260,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*(long *)(ctx + 0x10) + 0x70));
  VStack_190.m_internal = (deUint64)(this->m_imageWidth * this->m_imageHeight * 4);
  local_1a8._0_4_ = 0xc;
  local_1a8._8_8_ = (DeviceInterface *)0x0;
  local_198 = (VkDevice)((ulong)local_198 & 0xffffffff00000000);
  local_188._0_4_ = 2;
  local_188._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  local_180 = CONCAT44(local_180._4_4_,
                       (deUint32)
                       ((ulong)((long)local_260.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_260.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2));
  local_178 = local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_3f8,vkd,device,
                     (VkBufferCreateInfo *)local_1a8,(VkAllocationCallbacks *)0x0);
  local_228.m_internal = (deUint64)local_3f8._M_dataplus._M_p;
  DStack_220.m_deviceIface = (DeviceInterface *)local_3f8._M_string_length;
  DStack_220.m_device = (VkDevice)local_3f8.field_2._M_allocated_capacity;
  DStack_220.m_allocator = (VkAllocationCallbacks *)local_3f8.field_2._8_8_;
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)local_1a8,vki,vkd,physicalDevice,device,
                   (VkBuffer)local_3f8._M_dataplus._M_p,in_stack_fffffffffffffbf8);
  commandBuffer = local_1e8;
  DStack_240.m_device._0_4_ = (VkBufferCreateFlags)local_198;
  DStack_240.m_device._4_4_ = local_198._4_4_;
  DStack_240.m_allocator._0_4_ = (undefined4)VStack_190.m_internal;
  DStack_240.m_allocator._4_4_ = VStack_190.m_internal._4_4_;
  local_248.m_internal = local_1a8._0_8_;
  DStack_240.m_deviceIface = (DeviceInterface *)local_1a8._8_8_;
  local_1a8._0_4_ = 0x2d;
  local_1a8._8_8_ = (DeviceInterface *)0x0;
  local_198 = (VkDevice)0x80000001000;
  VStack_190.m_internal = 0x600000007;
  local_188._0_4_ = 0xffffffff;
  local_188._4_4_ = ~VK_SHARING_MODE_EXCLUSIVE;
  local_180 = (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
              m_internal;
  local_178 = (pointer)&DAT_00000001;
  uStack_170 = 1;
  local_168 = 1;
  local_3f8._M_dataplus._M_p._0_4_ = 0x2c;
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_allocated_capacity = 0x200000001000;
  local_3f8.field_2._8_8_ = 0xffffffffffffffff;
  local_3d8 = (pointer)local_228.m_internal;
  local_3d0 = 0;
  local_3c8 = 0xffffffffffffffff;
  local_2d8 = (ulong *)0x0;
  lStack_2d0 = 0;
  local_2c8 = 1;
  lStack_2c0 = 0x100000000;
  local_2b8 = 0;
  local_2b0 = 0;
  local_2ac._0_4_ = this->m_imageWidth;
  local_2ac._4_4_ = this->m_imageHeight;
  local_2a4 = 1;
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,local_1e8,0x1000,0x1000,0,0,0,0,0,1,
             (Move<vk::Handle<(vk::HandleType)7>_> *)local_1a8);
  (*vkd->_vptr_DeviceInterface[99])
            (vkd,commandBuffer,
             (this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,local_228.m_internal,1,&local_2d8);
  (*vkd->_vptr_DeviceInterface[0x6d])(vkd,commandBuffer,0x1000,0x4000,0,0,0,1,&local_3f8,0,0);
  VVar5 = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,commandBuffer);
  ::vk::checkResult(VVar5,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xa77);
  queueRun(vkd,local_1f0,commandBuffer);
  VVar5 = (*vkd->_vptr_DeviceInterface[7])
                    (vkd,device,local_248.m_internal,0,
                     (long)(this->m_imageWidth * this->m_imageHeight * 4),0,
                     (Move<vk::Handle<(vk::HandleType)7>_> *)local_1a8);
  ::vk::checkResult(VVar5,"vkd.mapMemory(device, memory, 0, size, 0, &ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2b3);
  uVar4 = local_1a8._0_8_;
  ::vk::invalidateMappedMemoryRange
            (vkd,device,local_248,0,(long)(this->m_imageWidth * this->m_imageHeight * 4));
  uVar6 = this->m_imageWidth * this->m_imageHeight;
  if ((uVar6 & 0x3fffffff) != 0) {
    uVar13 = 0;
    do {
      if (((*(ulong *)(*(long *)(local_380 + 0x30) + (uVar13 >> 6) * 8) >> (uVar13 & 0x3f) & 1) != 0
          ) && (*(VkCommandBuffer_s *)(uVar4 + uVar13) !=
                *(VkCommandBuffer_s *)(*(long *)(local_380 + 0x18) + uVar13))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_1c8);
        local_2f8 = &local_2e8;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_2e8 = *plVar10;
          uStack_2e0 = (undefined4)plVar8[3];
          uStack_2dc = *(undefined4 *)((long)plVar8 + 0x1c);
        }
        else {
          local_2e8 = *plVar10;
          local_2f8 = (long *)*plVar8;
        }
        local_2f0 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
        local_280 = &local_270;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_270 = *plVar10;
          lStack_268 = plVar8[3];
        }
        else {
          local_270 = *plVar10;
          local_280 = (long *)*plVar8;
        }
        local_278 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_280);
        puVar11 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar11) {
          local_368 = *puVar11;
          lStack_360 = plVar8[3];
          local_378 = &local_368;
        }
        else {
          local_368 = *puVar11;
          local_378 = (ulong *)*plVar8;
        }
        local_370 = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        bVar2 = *(byte *)(*(long *)(local_380 + 0x18) + uVar13);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        local_318.value = (deUint64)(ulong)bVar2;
        tcu::Format::Hex<8UL>::toStream(&local_318,(ostream *)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar12 = 0xf;
        if (local_378 != &local_368) {
          uVar12 = local_368;
        }
        if (uVar12 < (ulong)(local_298 + local_370)) {
          uVar12 = 0xf;
          if (local_2a0 != local_290) {
            uVar12 = local_290[0];
          }
          if (uVar12 < (ulong)(local_298 + local_370)) goto LAB_00653f7f;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_378);
        }
        else {
LAB_00653f7f:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_2a0);
        }
        local_3c0 = &local_3b0;
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_3b0 = *plVar8;
          uStack_3a8 = puVar9[3];
        }
        else {
          local_3b0 = *plVar8;
          local_3c0 = (long *)*puVar9;
        }
        local_3b8 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)plVar8 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3c0);
        puVar11 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar11) {
          local_348 = *puVar11;
          lStack_340 = plVar8[3];
          local_358 = &local_348;
        }
        else {
          local_348 = *puVar11;
          local_358 = (ulong *)*plVar8;
        }
        local_350 = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        VVar3 = *(VkCommandBuffer_s *)(uVar4 + uVar13);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        local_338.value = (deUint64)(ulong)(byte)VVar3;
        tcu::Format::Hex<8UL>::toStream(&local_338,(ostream *)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar13 = 0xf;
        if (local_358 != &local_348) {
          uVar13 = local_348;
        }
        if (uVar13 < (ulong)(local_310 + local_350)) {
          uVar13 = 0xf;
          if ((ulong *)local_318.value != local_308) {
            uVar13 = local_308[0];
          }
          if (uVar13 < (ulong)(local_310 + local_350)) goto LAB_00654103;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,(ulong)local_358);
        }
        else {
LAB_00654103:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_358,local_318.value)
          ;
        }
        local_3a0 = &local_390;
        plVar8 = puVar9 + 2;
        if ((long *)*puVar9 == plVar8) {
          local_390 = *plVar8;
          uStack_388 = puVar9[3];
        }
        else {
          local_390 = *plVar8;
          local_3a0 = (long *)*puVar9;
        }
        local_398 = puVar9[1];
        *puVar9 = plVar8;
        puVar9[1] = 0;
        *(undefined1 *)plVar8 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        puVar11 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar11) {
          local_2c8 = *puVar11;
          lStack_2c0 = plVar8[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *puVar11;
          local_2d8 = (ulong *)*plVar8;
        }
        lStack_2d0 = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar13 = 0xf;
        if (local_2d8 != &local_2c8) {
          uVar13 = local_2c8;
        }
        if (uVar13 < (ulong)(local_330 + lStack_2d0)) {
          uVar13 = 0xf;
          if ((ulong *)local_338.value != local_328) {
            uVar13 = local_328[0];
          }
          if (uVar13 < (ulong)(local_330 + lStack_2d0)) goto LAB_0065427a;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,(ulong)local_2d8);
        }
        else {
LAB_0065427a:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,local_338.value)
          ;
        }
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        psVar1 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_3f8.field_2._M_allocated_capacity = *psVar1;
          local_3f8.field_2._8_8_ = puVar9[3];
        }
        else {
          local_3f8.field_2._M_allocated_capacity = *psVar1;
          local_3f8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_3f8._M_string_length = puVar9[1];
        *puVar9 = psVar1;
        puVar9[1] = 0;
        *(undefined1 *)psVar1 = 0;
        tcu::ResultCollector::fail(local_200,&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((ulong *)local_338.value != local_328) {
          operator_delete((void *)local_338.value,local_328[0] + 1);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8,local_2c8 + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390 + 1);
        }
        if ((ulong *)local_318.value != local_308) {
          operator_delete((void *)local_318.value,local_308[0] + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,local_348 + 1);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0,local_3b0 + 1);
        }
        if (local_2a0 != local_290) {
          operator_delete(local_2a0,local_290[0] + 1);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378,local_368 + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,local_270 + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,local_2e8 + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        break;
      }
      uVar13 = uVar13 + 1;
    } while ((long)(int)(uVar6 * 4) != uVar13);
  }
  iVar7 = (*vkd->_vptr_DeviceInterface[8])(vkd,device,local_248.m_internal);
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_240,local_248);
    iVar7 = extraout_EAX;
  }
  if (local_228.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_220,local_228);
    iVar7 = extraout_EAX_00;
  }
  if (local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    iVar7 = extraout_EAX_01;
  }
  if (commandBuffer != (VkCommandBuffer)0x0) {
    local_1a8._0_8_ = commandBuffer;
    iVar7 = (*pDStack_1e0->_vptr_DeviceInterface[0x48])(pDStack_1e0,local_1d8,dStack_1d0,1);
  }
  return iVar7;
}

Assistant:

void BufferCopyToImage::verify (VerifyContext& context, size_t commandIndex)
{
	tcu::ResultCollector&					resultCollector	(context.getResultCollector());
	ReferenceMemory&						reference		(context.getReference());
	const vk::InstanceInterface&			vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&				vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice				physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice						device			= context.getContext().getDevice();
	const vk::VkQueue						queue			= context.getContext().getQueue();
	const vk::VkCommandPool					commandPool		= context.getContext().getCommandPool();
	const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vector<deUint32>&					queueFamilies	= context.getContext().getQueueFamilies();
	const vk::Unique<vk::VkBuffer>			dstBuffer		(createBuffer(vkd, device, 4 * m_imageWidth * m_imageHeight, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies));
	const vk::Unique<vk::VkDeviceMemory>	memory			(bindBufferMemory(vki, vkd, physicalDevice, device, *dstBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT));
	{
		const vk::VkImageMemoryBarrier		imageBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_TRANSFER_READ_BIT,

			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_dstImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkBufferMemoryBarrier bufferBarrier =
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			vk::VK_ACCESS_HOST_READ_BIT,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,
			*dstBuffer,
			0,
			VK_WHOLE_SIZE
		};

		const vk::VkBufferImageCopy	region =
		{
			0,
			0, 0,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// mipLevel
				0,	// arrayLayer
				1	// layerCount
			},
			{ 0, 0, 0 },
			{
				(deUint32)m_imageWidth,
				(deUint32)m_imageHeight,
				1u
			}
		};

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &imageBarrier);
		vkd.cmdCopyImageToBuffer(*commandBuffer, *m_dstImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *dstBuffer, 1, &region);
		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	queueRun(vkd, queue, *commandBuffer);

	{
		void* const	ptr		= mapMemory(vkd, device, *memory, 4 * m_imageWidth * m_imageHeight);

		vk::invalidateMappedMemoryRange(vkd, device, *memory, 0,  4 * m_imageWidth * m_imageHeight);

		{
			const deUint8* const	data = (const deUint8*)ptr;

			for (size_t pos = 0; pos < (size_t)( 4 * m_imageWidth * m_imageHeight); pos++)
			{
				if (reference.isDefined(pos))
				{
					if (data[pos] != reference.get(pos))
					{
						resultCollector.fail(
								de::toString(commandIndex) + ":" + getName()
								+ " Result differs from reference, Expected: "
								+ de::toString(tcu::toHex<8>(reference.get(pos)))
								+ ", Got: "
								+ de::toString(tcu::toHex<8>(data[pos]))
								+ ", At offset: "
								+ de::toString(pos));
						break;
					}
				}
			}
		}

		vkd.unmapMemory(device, *memory);
	}
}